

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPolyn.c
# Opt level: O2

void Gia_PolynBuildOne(Pln_Man_t *p,int iMono)

{
  uint uVar1;
  Gia_Man_t *p_00;
  uint *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int Entry;
  uint uVar6;
  Vec_Int_t *pVVar7;
  Gia_Obj_t *pObj;
  Vec_Int_t *pVVar8;
  ulong uVar9;
  int i;
  int i_00;
  long lVar10;
  
  if (p->vCoefs->nSize != p->pHashM->vMap->nSize) {
    __assert_fail("Vec_IntSize(p->vCoefs) == Hsh_VecSize(p->pHashM)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecPolyn.c"
                  ,0x109,"void Gia_PolynBuildOne(Pln_Man_t *, int)");
  }
  pVVar7 = Hsh_VecReadEntry(p->pHashM,iMono);
  iVar3 = Vec_IntEntryLast(pVVar7);
  pObj = Gia_ManObj(p->pGia,iVar3);
  if ((~*(uint *)pObj & 0x1fffffff) == 0 || (int)*(uint *)pObj < 0) {
    return;
  }
  p_00 = p->pGia;
  iVar3 = Gia_ObjId(p_00,pObj);
  puVar2 = p_00->pMuxes;
  if ((puVar2 != (uint *)0x0) && (puVar2[iVar3] != 0)) {
    __assert_fail("!Gia_ObjIsMux(p->pGia, pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecPolyn.c"
                  ,0x10f,"void Gia_PolynBuildOne(Pln_Man_t *, int)");
  }
  iVar3 = Vec_IntEntry(p->vCoefs,iMono);
  if (iVar3 == 0) {
    return;
  }
  Vec_IntWriteEntry(p->vCoefs,iMono,0);
  p->nUsed = p->nUsed + -1;
  iVar4 = Gia_ObjFaninId0p(p->pGia,pObj);
  iVar5 = Gia_ObjId(p->pGia,pObj);
  uVar1 = *(uint *)&pObj->field_0x4;
  for (uVar9 = 0; uVar9 != 4; uVar9 = uVar9 + 1) {
    pVVar8 = p->vTempM[uVar9];
    pVVar8->nSize = 0;
    for (i_00 = 0; i_00 < pVVar7->nSize; i_00 = i_00 + 1) {
      Entry = Vec_IntEntry(pVVar7,i_00);
      Vec_IntPush(pVVar8,Entry);
    }
    pVVar8 = p->vTempM[uVar9];
    if (pVVar8->nSize < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
    }
    pVVar8->nSize = pVVar8->nSize + -1;
    if ((uVar9 & 1) != 0) {
      Vec_IntPushUniqueOrderCost(pVVar8,iVar4,p->vOrder);
    }
    if (1 < uVar9) {
      Vec_IntPushUniqueOrderCost(p->vTempM[uVar9],iVar5 - (uVar1 & 0x1fffffff),p->vOrder);
    }
  }
  pVVar7 = Hsh_VecReadEntry(p->pHashC,iVar3);
  iVar4 = Gia_ObjIsXor(pObj);
  if (iVar4 == 0) {
    for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
      Vec_IntAppendMinus(p->vTempC[lVar10],pVVar7,(int)lVar10);
    }
  }
  iVar4 = Gia_ObjIsXor(pObj);
  if (iVar4 == 0) {
    uVar9 = *(ulong *)pObj;
    pVVar7 = p->vTempC[0];
    if (((uint)uVar9 >> 0x1d & 1) == 0) {
      if ((uVar9 >> 0x3d & 1) == 0) goto LAB_0054427c;
      pVVar8 = p->vTempM[1];
    }
    else {
      if ((uVar9 >> 0x3d & 1) != 0) {
        Gia_PolynBuildAdd(p,pVVar7,p->vTempM[0]);
        Gia_PolynBuildAdd(p,p->vTempC[1],p->vTempM[1]);
        pVVar7 = Hsh_VecReadEntry(p->pHashC,iVar3);
        for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
          Vec_IntAppendMinus(p->vTempC[lVar10],pVVar7,(int)lVar10);
        }
        Gia_PolynBuildAdd(p,p->vTempC[1],p->vTempM[2]);
        goto LAB_00544278;
      }
      pVVar8 = p->vTempM[2];
    }
    Gia_PolynBuildAdd(p,pVVar7,pVVar8);
    pVVar7 = p->vTempC[1];
  }
  else {
    pVVar7 = Hsh_VecReadEntry(p->pHashC,iVar3);
    Vec_IntAppendMinus(p->vTempC[0],pVVar7,0);
    Gia_PolynBuildAdd(p,p->vTempC[0],p->vTempM[1]);
    pVVar7 = Hsh_VecReadEntry(p->pHashC,iVar3);
    Vec_IntAppendMinus(p->vTempC[0],pVVar7,0);
    Gia_PolynBuildAdd(p,p->vTempC[0],p->vTempM[2]);
    pVVar8 = Hsh_VecReadEntry(p->pHashC,iVar3);
    pVVar7 = p->vTempC[0];
    pVVar7->nSize = 0;
    for (iVar3 = 0; iVar3 < pVVar8->nSize; iVar3 = iVar3 + 1) {
      uVar6 = Vec_IntEntry(pVVar8,iVar3);
      uVar1 = 1 - uVar6;
      if (0 < (int)uVar6) {
        uVar1 = ~uVar6;
      }
      Vec_IntPush(pVVar7,uVar1);
    }
LAB_00544278:
    pVVar7 = p->vTempC[0];
  }
LAB_0054427c:
  Gia_PolynBuildAdd(p,pVVar7,p->vTempM[3]);
  return;
}

Assistant:

void Gia_PolynBuildOne( Pln_Man_t * p, int iMono )
{
    Gia_Obj_t * pObj; 
    Vec_Int_t * vArray, * vConst;
    int iFan0, iFan1;
    int k, iConst, iDriver;

    assert( Vec_IntSize(p->vCoefs) == Hsh_VecSize(p->pHashM) );
    vArray  = Hsh_VecReadEntry( p->pHashM, iMono );
    iDriver = Vec_IntEntryLast( vArray );
    pObj    = Gia_ManObj( p->pGia, iDriver );
    if ( !Gia_ObjIsAnd(pObj) )
        return;
    assert( !Gia_ObjIsMux(p->pGia, pObj) );

    iConst = Vec_IntEntry( p->vCoefs, iMono );
    if ( iConst == 0 )
        return;
    Vec_IntWriteEntry( p->vCoefs, iMono, 0 );
    p->nUsed--;

    iFan0 = Gia_ObjFaninId0p(p->pGia, pObj);
    iFan1 = Gia_ObjFaninId1p(p->pGia, pObj);
    for ( k = 0; k < 4; k++ )
    {
        Vec_IntClear( p->vTempM[k] );
        Vec_IntAppend( p->vTempM[k], vArray );
        Vec_IntPop( p->vTempM[k] );
        if ( k == 1 || k == 3 )
            Vec_IntPushUniqueOrderCost( p->vTempM[k], iFan0, p->vOrder );    // x
//            Vec_IntPushUniqueOrder( p->vTempM[k], iFan0 );    // x
        if ( k == 2 || k == 3 )
            Vec_IntPushUniqueOrderCost( p->vTempM[k], iFan1, p->vOrder );    // y
//            Vec_IntPushUniqueOrder( p->vTempM[k], iFan1 );    // y
    }

    vConst = Hsh_VecReadEntry( p->pHashC, iConst );

    if ( !Gia_ObjIsXor(pObj) )
        for ( k = 0; k < 2; k++ )
            Vec_IntAppendMinus( p->vTempC[k], vConst, k );

    if ( Gia_ObjIsXor(pObj) )
    {
        vConst = Hsh_VecReadEntry( p->pHashC, iConst );
        Vec_IntAppendMinus( p->vTempC[0], vConst, 0 );
        Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[1] );   //  C * x 

        vConst = Hsh_VecReadEntry( p->pHashC, iConst );
        Vec_IntAppendMinus( p->vTempC[0], vConst, 0 );
        Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[2] );   //  C * y 

        //if ( !p->pGia->vXors || Vec_IntFind(p->pGia->vXors, iDriver) == -1 || Vec_IntFind(p->pGia->vXors, iDriver) == 5 )
        { 
            vConst = Hsh_VecReadEntry( p->pHashC, iConst );
            Vec_IntAppendMinus2x( p->vTempC[0], vConst );
            Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[3] );   // -C * x * y 
        }
    }
    else if ( Gia_ObjFaninC0(pObj) && Gia_ObjFaninC1(pObj) )  //  C * (1 - x) * (1 - y)
    {
        Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[0] );   //  C * 1
        Gia_PolynBuildAdd( p, p->vTempC[1], p->vTempM[1] );   // -C * x
        vConst = Hsh_VecReadEntry( p->pHashC, iConst );
        for ( k = 0; k < 2; k++ )
            Vec_IntAppendMinus( p->vTempC[k], vConst, k );
        Gia_PolynBuildAdd( p, p->vTempC[1], p->vTempM[2] );   // -C * y 
        Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[3] );   //  C * x * y
    }
    else if ( Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj) ) //  C * (1 - x) * y
    {
        Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[2] );   //  C * y 
        Gia_PolynBuildAdd( p, p->vTempC[1], p->vTempM[3] );   // -C * x * y
    }
    else if ( !Gia_ObjFaninC0(pObj) && Gia_ObjFaninC1(pObj) ) //  C * x * (1 - y)
    {
        Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[1] );   //  C * x 
        Gia_PolynBuildAdd( p, p->vTempC[1], p->vTempM[3] );   // -C * x * y
    }
    else   
        Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[3] );   //  C * x * y
}